

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ordermatch.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  ostream *poVar2;
  OrderMatcher *pOVar3;
  exception *e;
  int local_54c;
  undefined1 local_548 [8];
  string value;
  SocketAcceptor acceptor;
  SessionSettings local_358;
  LogFactory local_2c8;
  ScreenLogFactory logFactory;
  MessageStoreFactory local_228;
  FileStoreFactory storeFactory;
  undefined1 local_170 [8];
  Application application;
  SessionSettings settings;
  allocator<char> local_39;
  string local_38 [8];
  string file;
  char **argv_local;
  int argc_local;
  
  file.field_2._8_8_ = argv;
  if (argc == 2) {
    __s = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
    std::allocator<char>::~allocator(&local_39);
    FIX::SessionSettings::SessionSettings
              ((SessionSettings *)&application.m_generator.m_executionID,local_38,false);
    Application::Application((Application *)local_170);
    FIX::FileStoreFactory::FileStoreFactory
              ((FileStoreFactory *)&local_228,
               (SessionSettings *)&application.m_generator.m_executionID);
    FIX::SessionSettings::SessionSettings
              (&local_358,(SessionSettings *)&application.m_generator.m_executionID);
    FIX::ScreenLogFactory::ScreenLogFactory((ScreenLogFactory *)&local_2c8,&local_358);
    FIX::SessionSettings::~SessionSettings(&local_358);
    FIX::SocketAcceptor::SocketAcceptor
              ((SocketAcceptor *)(value.field_2._M_local_buf + 8),(Application *)local_170,
               &local_228,(SessionSettings *)&application.m_generator.m_executionID,&local_2c8);
    FIX::Acceptor::start();
    do {
      std::__cxx11::string::string((string *)local_548);
      std::operator>>((istream *)&std::cin,(string *)local_548);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_548,"#symbols");
      if (bVar1) {
        pOVar3 = Application::orderMatcher((Application *)local_170);
        OrderMatcher::display(pOVar3);
LAB_0016136c:
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        local_54c = 0;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_548,"#quit");
        if (!bVar1) {
          pOVar3 = Application::orderMatcher((Application *)local_170);
          std::__cxx11::string::string((string *)&e,(string *)local_548);
          OrderMatcher::display(pOVar3,(string *)&e);
          std::__cxx11::string::~string((string *)&e);
          goto LAB_0016136c;
        }
        local_54c = 3;
      }
      std::__cxx11::string::~string((string *)local_548);
    } while (local_54c == 0);
    FIX::Acceptor::stop((bool)((char)&value + '\x18'));
    local_54c = 1;
    FIX::SocketAcceptor::~SocketAcceptor((SocketAcceptor *)(value.field_2._M_local_buf + 8));
    FIX::ScreenLogFactory::~ScreenLogFactory((ScreenLogFactory *)&local_2c8);
    FIX::FileStoreFactory::~FileStoreFactory((FileStoreFactory *)&local_228);
    Application::~Application((Application *)local_170);
    FIX::SessionSettings::~SessionSettings
              ((SessionSettings *)&application.m_generator.m_executionID);
    std::__cxx11::string::~string(local_38);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar2 = std::operator<<(poVar2,*(char **)file.field_2._8_8_);
    poVar2 = std::operator<<(poVar2," FILE.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 2) {
    std::cout << "usage: " << argv[0] << " FILE." << std::endl;
    return 0;
  }
  std::string file = argv[1];

  try {
    FIX::SessionSettings settings(file);

    Application application;
    FIX::FileStoreFactory storeFactory(settings);
    FIX::ScreenLogFactory logFactory(settings);
    FIX::SocketAcceptor acceptor(application, storeFactory, settings, logFactory);

    acceptor.start();
    while (true) {
      std::string value;
      std::cin >> value;

      if (value == "#symbols") {
        application.orderMatcher().display();
      } else if (value == "#quit") {
        break;
      } else {
        application.orderMatcher().display(value);
      }

      std::cout << std::endl;
    }
    acceptor.stop();
    return 0;
  } catch (std::exception &e) {
    std::cout << e.what() << std::endl;
    return 1;
  }
}